

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupport_c_NoExceptionsAreThrownWhenAMock_cCallFailed_Test::testBody
          (TEST_MockSupport_c_NoExceptionsAreThrownWhenAMock_cCallFailed_Test *this)

{
  byte bVar1;
  UtestShell *pUVar2;
  size_t sVar3;
  TestTerminator *pTVar4;
  undefined1 local_40 [8];
  TestTestingFixture fixture;
  TEST_MockSupport_c_NoExceptionsAreThrownWhenAMock_cCallFailed_Test *this_local;
  
  fixture.result_ = (TestResult *)this;
  TestTestingFixture::TestTestingFixture((TestTestingFixture *)local_40);
  TestTestingFixture::setTestFunction((TestTestingFixture *)local_40,failedCallToMockC);
  TestTestingFixture::runAllTests((TestTestingFixture *)local_40);
  pUVar2 = UtestShell::getCurrent();
  sVar3 = TestTestingFixture::getFailureCount((TestTestingFixture *)local_40);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,1,sVar3,"LONGS_EQUAL(1, fixture.getFailureCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
             ,0x287,pTVar4);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = destructorWasCalled ^ 1;
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(bVar1 & 1),"CHECK","!destructorWasCalled",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
             ,0x289,pTVar4);
  TestTestingFixture::~TestTestingFixture((TestTestingFixture *)local_40);
  return;
}

Assistant:

MSC_SWITCHED_TEST(MockSupport_c, NoExceptionsAreThrownWhenAMock_cCallFailed)
{
    TestTestingFixture fixture;

    fixture.setTestFunction(failedCallToMockC);
    fixture.runAllTests();

    LONGS_EQUAL(1, fixture.getFailureCount());
    // Odd behavior in Visual C++, destructor still gets called here
    CHECK(!destructorWasCalled);
}